

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange assignmentRange;
  size_type index_00;
  bool bVar1;
  bitmask<slang::ast::ASTFlags> extraFlags;
  size_t sVar2;
  SourceRange *in_RDX;
  EVP_PKEY_CTX *src;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  ReplicatedAssignmentPatternExpression *result;
  Expression *expr;
  ExpressionSyntax *item;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2_1;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  size_t index;
  bool bad;
  Diagnostic *diag;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end2;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  Expression *countExpr;
  size_t count;
  Expression *in_stack_fffffffffffffd48;
  Compilation *in_stack_fffffffffffffd50;
  unsigned_long in_stack_fffffffffffffd58;
  Diagnostic *in_stack_fffffffffffffd60;
  ASTContext *in_stack_fffffffffffffd68;
  SourceLocation in_stack_fffffffffffffd70;
  SourceLocation in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  DiagCode code;
  SourceRange *in_stack_fffffffffffffd90;
  Type *in_stack_fffffffffffffd98;
  Diagnostic *in_stack_fffffffffffffda0;
  Type *in_stack_fffffffffffffda8;
  BumpAllocator *in_stack_fffffffffffffdb0;
  Compilation *in_stack_fffffffffffffdb8;
  ASTContext *in_stack_fffffffffffffdf0;
  ExpressionSyntax *in_stack_fffffffffffffdf8;
  Type *in_stack_fffffffffffffe00;
  SourceLocation in_stack_fffffffffffffe10;
  SourceLocation in_stack_fffffffffffffe18;
  bitmask<slang::ast::ASTFlags> local_188 [3];
  Type *local_170;
  Type *local_168;
  const_iterator local_160;
  const_iterator local_150;
  long local_140;
  SmallVectorBase<const_slang::ast::Expression_*> local_138 [2];
  size_type local_f8;
  byte local_ed;
  undefined4 local_ec;
  undefined4 local_d4;
  Diagnostic *local_d0;
  SourceLocation local_c8;
  SourceLocation local_c0;
  Symbol *local_b8;
  Symbol *local_b0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_98;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *local_88;
  SmallVectorBase<const_slang::ast::Type_*> local_80 [2];
  Expression *local_40;
  long local_38;
  SourceRange *local_20;
  long local_18;
  EVP_PKEY_CTX *local_10;
  ReplicatedAssignmentPatternExpression *local_8;
  
  local_38 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7e993c);
  local_40 = bindReplCount(in_stack_fffffffffffffdb8,(ExpressionSyntax *)in_stack_fffffffffffffdb0,
                           (ASTContext *)in_stack_fffffffffffffda8,
                           (size_t *)in_stack_fffffffffffffda0);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffd50);
  if (bVar1) {
    local_8 = (ReplicatedAssignmentPatternExpression *)
              Expression::badExpr(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  }
  else {
    SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x7e99a2);
    local_98 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)in_stack_fffffffffffffd60);
    local_88 = &local_98;
    local_b0 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(local_88);
    local_b8 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
               ::end(local_88);
    while( true ) {
      bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                        ((self_type *)in_stack_fffffffffffffd50,
                         (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                         in_stack_fffffffffffffd48);
      code = SUB84((ulong)in_stack_fffffffffffffd80 >> 0x20,0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffe18 =
           (SourceLocation)
           iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
           ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                        *)0x7e9a7c);
      local_c0 = in_stack_fffffffffffffe18;
      in_stack_fffffffffffffe10 = (SourceLocation)ValueSymbol::getType((ValueSymbol *)0x7e9aa3);
      local_c8 = in_stack_fffffffffffffe10;
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)in_stack_fffffffffffffd50,
                 (Type **)in_stack_fffffffffffffd48);
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
      operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                  *)in_stack_fffffffffffffd50);
    }
    extraFlags.m_bits = SmallVectorBase<const_slang::ast::Type_*>::size(local_80);
    sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x7e9b29);
    if (extraFlags.m_bits == sVar2 * local_38) {
      local_ed = 0;
      local_f8 = 0;
      SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x7e9c73);
      local_140 = local_18 + 0x40;
      local_150 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x7e9c94);
      local_160 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x7e9cd3);
      while( true ) {
        bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffffd50,
                           (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                           in_stack_fffffffffffffd48);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_168 = (Type *)iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                            ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                                         *)0x7e9d3c);
        index_00 = local_f8;
        local_f8 = local_f8 + 1;
        in_stack_fffffffffffffdb0 =
             (BumpAllocator *)
             SmallVectorBase<const_slang::ast::Type_*>::operator[](local_80,index_00);
        in_stack_fffffffffffffda0 = *(Diagnostic **)&in_stack_fffffffffffffdb0->head;
        in_stack_fffffffffffffda8 = local_168;
        SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffd50);
        in_stack_fffffffffffffd90 = local_20;
        bitmask<slang::ast::ASTFlags>::bitmask(local_188,None);
        assignmentRange.endLoc = in_stack_fffffffffffffe18;
        assignmentRange.startLoc = in_stack_fffffffffffffe10;
        in_stack_fffffffffffffd98 =
             (Type *)Expression::bindRValue
                               (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,assignmentRange,
                                in_stack_fffffffffffffdf0,extraFlags);
        local_170 = in_stack_fffffffffffffd98;
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffd50,
                   (Expression **)in_stack_fffffffffffffd48);
        bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffd50);
        local_ed = (local_ed & 1) != 0 || bVar1;
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffffd50);
      }
      SmallVectorBase<const_slang::ast::Expression_*>::copy(local_138,local_10,src);
      local_8 = BumpAllocator::
                emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                          (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                           (Expression *)in_stack_fffffffffffffda0,
                           (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                           in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if ((local_ed & 1) != 0) {
        local_8 = (ReplicatedAssignmentPatternExpression *)
                  Expression::badExpr(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
      local_ec = 1;
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x7e9f95);
    }
    else {
      local_d4 = 0xae0007;
      sourceRange_00.endLoc = in_stack_fffffffffffffd78;
      sourceRange_00.startLoc = in_stack_fffffffffffffd70;
      local_d0 = ASTContext::addDiag(in_stack_fffffffffffffd68,code,sourceRange_00);
      ast::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      SmallVectorBase<const_slang::ast::Type_*>::size(local_80);
      Diagnostic::operator<<<unsigned_long>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x7e9bf9);
      Diagnostic::operator<<<unsigned_long>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_8 = (ReplicatedAssignmentPatternExpression *)
                Expression::badExpr(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_ec = 1;
    }
    SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x7e9fa2);
  }
  return (Expression *)local_8;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindRValue(*types[index++], *item, {}, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}